

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::scheduler_operation>::~op_queue
          (op_queue<boost::asio::detail::scheduler_operation> *this)

{
  scheduler_operation *this_00;
  
  while (this_00 = this->front_, this_00 != (scheduler_operation *)0x0) {
    pop(this);
    scheduler_operation::destroy(this_00);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }